

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg,bool any_reparse)

{
  JsonLocation *pJVar1;
  int *piVar2;
  undefined1 *puVar3;
  byte bVar4;
  iterator iVar5;
  pointer pcVar6;
  size_t sVar7;
  undefined1 auVar8 [8];
  undefined4 uVar9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  MessageType MVar14;
  int iVar15;
  Status SVar16;
  string *psVar17;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> f;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar18;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  anon_unknown_5 *extraout_RAX_01;
  Field pFVar19;
  anon_unknown_5 *extraout_RAX_02;
  anon_unknown_5 *extraout_RAX_03;
  anon_unknown_5 *extraout_RAX_04;
  uintptr_t extraout_RAX_05;
  undefined8 uVar20;
  undefined1 x;
  int32_t x_00;
  char *pcVar21;
  char *pcVar22;
  undefined7 in_register_00000081;
  pointer *ppCVar23;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  *this_00;
  MessagePath *pMVar24;
  string_view literal;
  string_view name;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> SVar25;
  optional<const_google::protobuf::FieldDescriptor_*> oVar26;
  string_view sVar27;
  string_view name_00;
  string_view x_01;
  string_view x_02;
  Status *_status;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  string_view correct_type_name;
  string_view extn_name;
  undefined1 local_1a8 [8];
  undefined1 auStack_1a0 [88];
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  size_t local_138;
  MessagePath *local_130;
  MessagePath *local_128;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_120;
  undefined1 auStack_118 [16];
  code *pcStack_108;
  undefined8 local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined1 local_e8 [36];
  int local_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  bool local_90;
  MessagePath *local_88;
  undefined1 local_80 [80];
  
  sVar27._M_str = (char *)desc;
  sVar27._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  pcVar21 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar14 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,sVar27);
  local_c4 = (int)(char *)CONCAT71(in_register_00000081,any_reparse);
  if (local_c4 != 0) {
switchD_002bacb3_caseD_3:
    SVar16 = JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) {
      return (Status)SVar16.rep_;
    }
    iVar15 = (lex->options_).recursion_depth;
    if (iVar15 == 0) {
      SVar16 = JsonLocation::Invalid
                         ((JsonLocation *)this,&lex->json_loc_,0x22,
                          "JSON content was too deeply nested");
      if (*(long *)this != 1) {
        return (Status)SVar16.rep_;
      }
    }
    else {
      (lex->options_).recursion_depth = iVar15 + -1;
      *(undefined8 *)this = 1;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal);
    if (bVar11) {
      piVar2 = &(lex->options_).recursion_depth;
      *piVar2 = *piVar2 + 1;
LAB_002bad1f:
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    pJVar1 = &lex->json_loc_;
LAB_002bad39:
    SVar16 = JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)SVar16.rep_;
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1a8);
    cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
    if ((cVar12 == '\"') ||
       (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 == '\'')) {
      JsonLexer::ParseUtf8
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_120.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_1a8,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_120.status_);
    }
    else {
      if ((lex->options_).allow_legacy_syntax != true) {
        JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,"expected \'\"\'");
        goto LAB_002bb9be;
      }
      JsonLexer::ParseBareWord
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_120.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_1a8,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_120.status_);
    }
    this_00 = &local_120;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&this_00->status_);
    *(undefined1 (*) [8])this = local_1a8;
    aVar18 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_1a8;
    if (((ulong)local_1a8 & 1) == 0) {
      LOCK();
      *(int *)local_1a8 = *(int *)local_1a8 + 1;
      UNLOCK();
      aVar18.status_.rep_ = *(Status *)this;
    }
    if (aVar18 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                   )0x1) goto LAB_002bb9be;
    pcVar21 = ":";
    JsonLexer::Expect((JsonLexer *)this,lex,1);
    if (*(long *)this != 1) goto LAB_002bb9be;
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_1a8 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1a8);
LAB_002bbe4a:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_120.status_);
      goto LAB_002bbe57;
    }
    if ((char)local_c4 != '\0') {
      bVar11 = json_internal::operator==((MaybeOwnedString *)auStack_1a0,(char (*) [6])"@type");
      if (bVar11) {
        JsonLexer::SkipValue((JsonLexer *)this);
      }
      else {
        if (MVar14 == kNotWellKnown) goto LAB_002bae8f;
        bVar11 = json_internal::operator==((MaybeOwnedString *)auStack_1a0,(char (*) [6])0x3d99d3);
        if (bVar11) {
          ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
                    (this,lex,desc,msg,false);
        }
        else {
          JsonLocation::Invalid
                    ((JsonLocation *)this,pJVar1,0x37,
                     "fields in a well-known-typed Any must be @type or value");
        }
      }
      goto LAB_002bb31a;
    }
LAB_002bae8f:
    psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a0);
    local_80._8_8_ = (psVar17->_M_dataplus)._M_p;
    local_80._0_8_ = psVar17->_M_string_length;
    if ((((Desc *)local_80._0_8_ == (Desc *)0x0) ||
        (*(char *)&((ZeroCopyBufferedStream *)local_80._8_8_)->stream_ != '[')) ||
       (((undefined1 *)
        ((long)&((ZeroCopyBufferedStream *)(local_80._8_8_ + -0x50))->outstanding_buffer_borrows_ +
        3))[local_80._0_8_] != ']')) {
      name_00._M_str = pcVar21;
      name_00._M_len = local_80._8_8_;
      oVar26 = Proto2Descriptor::FieldByName
                         ((Proto2Descriptor *)desc,(Desc *)local_80._0_8_,name_00);
      f = oVar26.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
          _M_payload;
      if (((undefined1  [16])
           oVar26.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
           _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_002bb0a1;
LAB_002bb00f:
      uVar10 = local_80._8_8_;
      uVar20 = local_80._0_8_;
      pMVar24 = lex->path_;
      bVar4 = (f._M_value)->type_;
      auStack_118 = (undefined1  [16])Proto2Descriptor::FieldTypeName(f._M_value);
      aVar18 = local_120;
      local_120.status_.rep_._1_3_ = 0;
      local_120.status_.rep_._0_1_ = bVar4;
      local_120.status_.rep_._4_4_ = aVar18._4_4_;
      pcStack_108 = (code *)uVar20;
      local_100 = uVar10;
      uStack_f8._0_1_ = 0xff;
      uStack_f8._1_3_ = 0xffffff;
      iVar5._M_current =
           (pMVar24->components_).
           super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (pMVar24->components_).
          super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                  (&pMVar24->components_,iVar5,(Component *)&local_120.status_);
      }
      else {
        ((iVar5._M_current)->field_name)._M_str = (char *)uVar10;
        *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(uStack_f4,0xffffffff);
        ((iVar5._M_current)->type_name)._M_str = (char *)auStack_118._8_8_;
        ((iVar5._M_current)->field_name)._M_len = uVar20;
        *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
          *)iVar5._M_current = local_120;
        ((iVar5._M_current)->type_name)._M_len = auStack_118._0_8_;
        ppCVar23 = &(pMVar24->components_).
                    super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar23 = *ppCVar23 + 1;
      }
      local_88 = pMVar24;
      bVar11 = ParseProto2Descriptor::HasParsed(f._M_value,msg,(lex->options_).allow_legacy_syntax);
      if (bVar11) {
        JsonLexer::PeekKind((JsonLexer *)&local_120.status_);
        aVar18 = local_120;
        uVar9 = auStack_118._0_4_;
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
                  ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)
                   &local_120.status_);
        if ((aVar18 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                        )0x1) && (uVar9 == 6)) goto LAB_002bb1bd;
        local_c0._0_8_ = local_80;
        local_c0._8_8_ =
             absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                  (&local_120,"\'%s\' has already been set (either directly or as part of a oneof)",
                   0x41,local_c0);
        JsonLocation::Invalid((JsonLocation *)this,pJVar1,auStack_118._0_8_,local_120);
        if (local_120 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )((long)auStack_118 + 8)) {
          operator_delete((void *)local_120,(ulong)(auStack_118._8_8_ + 1));
        }
      }
      else {
LAB_002bb1bd:
        if (((f._M_value)->type_ == '\v') &&
           (bVar11 = FieldDescriptor::is_map_message_type(f._M_value), bVar11)) {
          ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                    ((JsonLexer *)this,
                     (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                     (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)f._M_value);
        }
        else {
          bVar11 = Proto2Descriptor::IsRepeated(f._M_value);
          if (bVar11) {
            if ((lex->options_).allow_legacy_syntax == true) {
              JsonLexer::PeekKind((JsonLexer *)&local_120.status_);
              aVar18 = local_120;
              uVar9 = auStack_118._0_4_;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)
                         &local_120.status_);
              if ((aVar18 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                              )0x1) || (uVar9 != 1)) goto LAB_002bb24b;
            }
            ParseArray<google::protobuf::json_internal::ParseProto2Descriptor>
                      ((JsonLexer *)this,
                       (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                       (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)f._M_value);
          }
          else {
LAB_002bb24b:
            ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                      ((JsonLexer *)this,
                       (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                       (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)f._M_value);
          }
        }
      }
      ppCVar23 = &(local_88->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar23 = *ppCVar23 + -1;
    }
    else {
      puVar3 = (undefined1 *)((long)&((Desc *)(local_80._0_8_ + -0x98))->reserved_name_count_ + 2);
      local_80._64_8_ = (long)&((Desc *)(local_80._0_8_ + -0x98))->reserved_name_count_ + 3;
      if (puVar3 <= (ulong)local_80._64_8_) {
        local_80._64_8_ = puVar3;
      }
      local_80._72_8_ = (long)&((ZeroCopyBufferedStream *)local_80._8_8_)->stream_ + 1;
      name._M_str = (char *)local_80._72_8_;
      name._M_len = local_80._64_8_;
      f._M_value = DescriptorPool::FindExtensionByName(desc->file_->pool_,name);
      if (f._M_value == (FieldDescriptor *)0x0) {
LAB_002bb0a1:
        if ((lex->options_).ignore_unknown_fields == false) {
          local_c0._0_8_ = local_80;
          local_c0._8_8_ =
               absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_120,"no such field: \'%s\'",0x13,local_c0);
          JsonLocation::Invalid((JsonLocation *)this,pJVar1,auStack_118._0_8_,local_120);
          if (local_120 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               )((long)auStack_118 + 8)) {
            pcVar21 = (char *)auStack_118._8_8_;
            aVar18 = local_120;
            goto LAB_002bb140;
          }
        }
        else {
          JsonLexer::SkipValue((JsonLexer *)this);
        }
      }
      else {
        local_80._56_8_ = desc->all_names_[1]._M_dataplus._M_p;
        local_80._48_8_ = desc->all_names_[1]._M_string_length;
        psVar17 = (f._M_value)->containing_type_->all_names_;
        if ((psVar17[1]._M_string_length == local_80._48_8_) &&
           ((local_80._48_8_ == 0 ||
            (iVar15 = bcmp(psVar17[1]._M_dataplus._M_p,(void *)local_80._56_8_,local_80._48_8_),
            iVar15 == 0)))) goto LAB_002bb00f;
        local_120 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )((long)local_80 + 0x40);
        auStack_118._8_8_ = local_80 + 0x30;
        auStack_118._0_8_ =
             absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        pcStack_108 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                      Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                  (local_c0,
                   "\'%s\' is a known extension name, but is not an extension of \'%s\' as expected"
                   ,0x4b,&local_120);
        JsonLocation::Invalid((JsonLocation *)this,pJVar1,local_c0._8_8_,local_c0._0_8_);
        pcVar21 = (char *)local_b0._0_8_;
        aVar18 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )local_c0._0_8_;
        if ((undefined1 *)local_c0._0_8_ == local_b0) goto LAB_002bb31a;
LAB_002bb140:
        operator_delete((void *)aVar18,(ulong)(pcVar21 + 1));
      }
    }
LAB_002bb31a:
    if (*(long *)this != 1) {
LAB_002bb9be:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1a8);
      return (Status)extraout_RAX;
    }
    literal_00._M_str = ",";
    literal_00._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal_00);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1a8);
    literal_01._M_str = "}";
    literal_01._M_len = 1;
    bVar13 = JsonLexer::Peek(lex,literal_01);
    if (!bVar13) goto code_r0x002bb362;
    piVar2 = &(lex->options_).recursion_depth;
    *piVar2 = *piVar2 + 1;
    if ((!bVar11) || ((lex->options_).allow_legacy_syntax != false)) goto LAB_002bad1f;
    pcVar21 = "expected \'}\'";
    goto LAB_002bb393;
  }
  if (MVar14 != kValue) {
    if (MVar14 == kStruct) {
      SVar16 = ParseStructValue<google::protobuf::json_internal::ParseProto2Descriptor>
                         (this,lex,desc,msg);
      return (Status)SVar16.rep_;
    }
    if (MVar14 == kAny) {
      SVar16 = JsonLexer::SkipToToken((JsonLexer *)this);
      if (*(long *)this != 1) {
        return (Status)SVar16.rep_;
      }
      ZeroCopyBufferedStream::BeginMark((ZeroCopyBufferedStream *)local_80);
      local_80._16_4_ = (undefined4)(lex->json_loc_).offset;
      local_80._20_4_ = *(undefined4 *)((long)&(lex->json_loc_).offset + 4);
      local_80._24_4_ = (undefined4)(lex->json_loc_).line;
      local_80._28_4_ = *(undefined4 *)((long)&(lex->json_loc_).line + 4);
      local_80._32_4_ = (undefined4)(lex->json_loc_).col;
      local_80._36_4_ = *(undefined4 *)((long)&(lex->json_loc_).col + 4);
      local_80._40_4_ = *(undefined4 *)&(lex->json_loc_).path;
      local_80._44_4_ = *(undefined4 *)((long)&(lex->json_loc_).path + 4);
      local_90 = false;
      SVar16 = JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
      if (*(long *)this == 1) {
        pJVar1 = &lex->json_loc_;
        iVar15 = (lex->options_).recursion_depth;
        if (iVar15 == 0) {
          SVar16 = JsonLocation::Invalid
                             ((JsonLocation *)this,pJVar1,0x22,"JSON content was too deeply nested")
          ;
          if (*(long *)this != 1) goto LAB_002bbe05;
        }
        else {
          (lex->options_).recursion_depth = iVar15 + -1;
          *(undefined8 *)this = 1;
        }
        literal_02._M_str = "}";
        literal_02._M_len = 1;
        bVar11 = JsonLexer::Peek(lex,literal_02);
        if (bVar11) {
          piVar2 = &(lex->options_).recursion_depth;
          *piVar2 = *piVar2 + 1;
LAB_002bb45e:
          *(undefined8 *)this = 1;
        }
        else {
          this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     *)local_1a8;
          do {
            JsonLexer::SkipToToken((JsonLexer *)this);
            SVar16.rep_ = (uintptr_t)this;
            if (*(long *)this != 1) goto LAB_002bbe05;
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&local_120.status_);
            cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
            if ((cVar12 != '\"') &&
               (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 != '\'')) {
              if ((lex->options_).allow_legacy_syntax == true) {
                JsonLexer::ParseBareWord
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&this_00->status_,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_120.status_,
                            (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&this_00->status_);
                goto LAB_002bb4f6;
              }
              JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,"expected \'\"\'");
LAB_002bbbe4:
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_120.status_);
              SVar16.rep_ = (uintptr_t)extraout_RAX_01;
              goto LAB_002bbbf6;
            }
            JsonLexer::ParseUtf8
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&this_00->status_,lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_120.status_,
                        (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&this_00->status_);
LAB_002bb4f6:
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&this_00->status_);
            *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              *)this = local_120;
            aVar18 = local_120;
            if (((ulong)local_120 & 1) == 0) {
              LOCK();
              *(int *)local_120 = *(int *)local_120 + 1;
              UNLOCK();
              aVar18.status_.rep_ = *(Status *)this;
            }
            if ((aVar18 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                            )0x1) ||
               (JsonLexer::Expect((JsonLexer *)this,lex,1,":"), *(long *)this != 1))
            goto LAB_002bbbe4;
            if (local_120 !=
                (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) goto LAB_002bbe4a;
            bVar11 = json_internal::operator==
                               ((MaybeOwnedString *)auStack_118,(char (*) [6])"@type");
            if (bVar11) {
              if (local_90 == true) {
                JsonLocation::Invalid((JsonLocation *)this,local_e8,0x15,"repeated @type in Any");
              }
              else {
                JsonLexer::ParseUtf8
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&this_00->status_,lex);
                *(undefined1 (*) [8])this = local_1a8;
                if (((ulong)local_1a8 & 1) == 0) {
                  LOCK();
                  *(int *)local_1a8 = *(int *)local_1a8 + 1;
                  UNLOCK();
                }
                if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )local_1a8 ==
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) {
                  std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                            ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_c0
                             ,(MaybeOwnedString *)auStack_1a0);
                  *(undefined8 *)this = 1;
                }
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)&this_00->status_);
              }
            }
            else {
              JsonLexer::SkipValue((JsonLexer *)this);
            }
            if (*(long *)this != 1) goto LAB_002bbbe4;
            literal_03._M_str = ",";
            literal_03._M_len = 1;
            bVar11 = JsonLexer::Peek(lex,literal_03);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_120.status_);
            literal_04._M_str = "}";
            literal_04._M_len = 1;
            bVar13 = JsonLexer::Peek(lex,literal_04);
            if (bVar13) {
              piVar2 = &(lex->options_).recursion_depth;
              *piVar2 = *piVar2 + 1;
              if ((!bVar11) || ((lex->options_).allow_legacy_syntax != false)) goto LAB_002bb45e;
              pcVar22 = "expected \'}\'";
              goto LAB_002bbbb2;
            }
          } while (bVar11);
          pcVar22 = "expected \',\'";
LAB_002bbbb2:
          SVar16 = JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,pcVar22);
LAB_002bbbf6:
          if (*(long *)this != 1) goto LAB_002bbe05;
        }
        sVar7 = *(size_t *)(local_80._8_8_ + 0x38);
        iVar15 = *(int *)(local_80._8_8_ + 0x4c);
        if (iVar15 == 0) {
          *(size_t *)(local_80._8_8_ + 0x40) = sVar7;
        }
        local_1a8 = (undefined1  [8])local_80._8_8_;
        auStack_1a0._8_8_ = (char *)(sVar7 - local_80._0_8_);
        auStack_1a0._0_8_ = local_80._0_8_;
        auStack_1a0[0x18] = 1;
        auStack_1a0._32_4_ = (undefined4)local_80._8_8_;
        auStack_1a0._36_4_ = SUB84(local_80._8_8_,4);
        *(int *)(local_80._8_8_ + 0x4c) = iVar15 + 2;
        if (iVar15 == -1) {
          *(size_t *)(local_80._8_8_ + 0x40) = sVar7;
        }
        ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_80._8_8_);
        sVar27 = MaybeOwnedString::AsView((MaybeOwnedString *)local_1a8);
        if ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a0._36_4_,auStack_1a0._32_4_) !=
            (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer
                    ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a0._36_4_,auStack_1a0._32_4_));
          auStack_1a0._32_4_ = 0;
          auStack_1a0._36_4_ = 0;
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
          ::_S_vtable._M_arr[(byte)auStack_1a0[0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_120.status_,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                    *)local_1a8);
        io::ArrayInputStream::ArrayInputStream
                  ((ArrayInputStream *)&local_120.status_,sVar27._M_str,(int)sVar27._M_len,-1);
        local_130 = lex->path_;
        auStack_1a0._68_4_ = 0;
        auStack_1a0._0_16_ = ZEXT816(0);
        auStack_1a0._16_8_ = (pointer)0x0;
        auStack_1a0[0x18] = 0;
        auStack_1a0._25_7_ = 0;
        auStack_1a0._32_4_ = 0;
        auStack_1a0._36_4_ = 0;
        auStack_1a0[0x28] = false;
        auStack_1a0._48_8_ = 0;
        auStack_1a0._56_8_ = 0;
        auStack_1a0[0x40] = false;
        auStack_1a0._72_8_ = *(undefined8 *)&lex->options_;
        auStack_1a0[0x50] = (lex->options_).allow_legacy_syntax;
        auStack_1a0._81_3_ = *(undefined3 *)&(lex->options_).field_0x9;
        local_148 = local_80._16_4_;
        uStack_144 = local_80._20_4_;
        uStack_140 = local_80._24_4_;
        uStack_13c = local_80._28_4_;
        local_138 = CONCAT44(local_80._36_4_,local_80._32_4_);
        local_1a8 = (undefined1  [8])&local_120;
        local_128 = local_130;
        if (local_90 == false) {
          if ((lex->options_).allow_legacy_syntax == false) {
            this = (anon_unknown_5 *)
                   JsonLocation::Invalid
                             ((JsonLocation *)this,local_80 + 0x10,0x14,"missing @type in Any");
          }
          else {
            JsonLexer::
            VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&)_1_>
                      ((JsonLexer *)this,
                       (LocationWith<google::protobuf::json_internal::Mark> *)local_1a8);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              *(undefined8 *)this = 1;
              this = extraout_RAX_02;
            }
          }
        }
        else {
          pFVar19 = Proto2Descriptor::MustHaveField(desc,1);
          sVar27 = MaybeOwnedString::AsView((MaybeOwnedString *)local_c0);
          x_02._M_str = pcVar21;
          x_02._M_len = (size_t)sVar27._M_str;
          ParseProto2Descriptor::SetString
                    ((ParseProto2Descriptor *)pFVar19,(Field)msg,(Msg *)sVar27._M_len,x_02);
          pFVar19 = Proto2Descriptor::MustHaveField(desc,2);
          psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)local_c0);
          this = (anon_unknown_5 *)
                 ParseProto2Descriptor::
                 NewDynamic<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(google::protobuf::Descriptor_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)_1_>
                           ((ParseProto2Descriptor *)this,pFVar19,psVar17,msg,(JsonLexer *)local_1a8
                           );
        }
        SVar16.rep_ = (uintptr_t)this;
        if ((pointer)auStack_1a0._16_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_1a0._16_8_,
                          CONCAT44(auStack_1a0._36_4_,auStack_1a0._32_4_) - auStack_1a0._16_8_);
          SVar16.rep_ = (uintptr_t)extraout_RAX_03;
        }
      }
LAB_002bbe05:
      if (local_90 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_c0);
        SVar16.rep_ = (uintptr_t)extraout_RAX_04;
      }
      if ((ZeroCopyBufferedStream *)local_80._8_8_ == (ZeroCopyBufferedStream *)0x0) {
        return (Status)SVar16.rep_;
      }
      ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_80._8_8_);
      return (Status)extraout_RAX_05;
    }
    JsonLexer::PeekKind((JsonLexer *)local_1a8);
    auVar8 = local_1a8;
    uVar9 = auStack_1a0._0_4_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)local_1a8);
    if ((((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )auVar8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) || (uVar9 != 0)) || ((lex->options_).allow_legacy_syntax == false)) {
      switch(MVar14) {
      case kWrapper:
        pFVar19 = Proto2Descriptor::MustHaveField(desc,1);
        SVar16 = ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                           ((JsonLexer *)this,
                            (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                            (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar19);
        return (Status)SVar16.rep_;
      case kList:
        SVar16 = ParseListValue<google::protobuf::json_internal::ParseProto2Descriptor>
                           (this,lex,desc,msg);
        return (Status)SVar16.rep_;
      case kTimestamp:
        SVar16 = ParseTimestamp<google::protobuf::json_internal::ParseProto2Descriptor>
                           ((JsonLexer *)this,
                            (Desc<google::protobuf::json_internal::ParseProto2Descriptor> *)lex,
                            (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)desc);
        return (Status)SVar16.rep_;
      case kDuration:
        SVar16 = ParseDuration<google::protobuf::json_internal::ParseProto2Descriptor>
                           (this,lex,desc,msg);
        return (Status)SVar16.rep_;
      case kFieldMask:
        SVar16 = ParseFieldMask<google::protobuf::json_internal::ParseProto2Descriptor>
                           ((JsonLexer *)this,
                            (Desc<google::protobuf::json_internal::ParseProto2Descriptor> *)lex,
                            (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)desc);
        return (Status)SVar16.rep_;
      }
    }
    goto switchD_002bacb3_caseD_3;
  }
  this_00 = &local_120;
  SVar25 = JsonLexer::PeekKind((JsonLexer *)&this_00->status_);
  uVar20 = SVar25.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
  *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
    *)this = local_120;
  aVar18 = local_120;
  if (((ulong)local_120 & 1) == 0) {
    LOCK();
    *(int *)local_120 = *(int *)local_120 + 1;
    UNLOCK();
    aVar18.status_.rep_ = *(Status *)this;
  }
  if (aVar18 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) goto LAB_002bbb81;
  if (local_120 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
LAB_002bbe57:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_120.status_);
LAB_002bbe64:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_120.status_);
    absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1a8);
LAB_002bbe7b:
    absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1a8);
LAB_002bbe85:
    uVar20 = absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1a8);
    *(long *)(&this_00->status_ + 1) = *(long *)(&this_00->status_ + 1) + -0x30;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_120.status_)
    ;
    _Unwind_Resume(uVar20);
  }
  switch(auStack_118._0_4_) {
  case 0:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,5,uVar20);
    pMVar24 = lex->path_;
    pcVar21 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._1_3_ = 0;
    local_1a8[0] = bVar4;
    auStack_1a0[0x18] = SUB81(pcVar21,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar21 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar21;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar5._M_current = local_1a8;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_8_;
      ppCVar23 = &(pMVar24->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar23 = *ppCVar23 + 1;
    }
    ParseProto2Descriptor::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&,auto:2&)_1_>
              ((ParseProto2Descriptor *)this,pFVar19,msg,(anon_class_8_1_ba1d5d7f)lex);
    goto LAB_002bbb1a;
  case 1:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,6,uVar20);
    pMVar24 = lex->path_;
    pcVar21 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._1_3_ = 0;
    local_1a8[0] = bVar4;
    auStack_1a0[0x18] = SUB81(pcVar21,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar21 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar21;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar5._M_current = local_1a8;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_8_;
      ppCVar23 = &(pMVar24->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar23 = *ppCVar23 + 1;
    }
    ParseProto2Descriptor::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&,auto:2&)_2_>
              ((ParseProto2Descriptor *)this,pFVar19,msg,(anon_class_8_1_ba1d5d7f)lex);
LAB_002bbb1a:
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar23 = *ppCVar23 + -1;
    goto LAB_002bbb81;
  case 2:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,3,uVar20);
    pMVar24 = lex->path_;
    pcVar22 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)bVar4;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._1_3_ = 0;
    local_1a8[0] = bVar4;
    auStack_1a0[0x18] = SUB81(pcVar22,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar5._M_current = local_1a8;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_8_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1a8,lex);
    *(undefined1 (*) [8])this = local_1a8;
    aVar18 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_1a8;
    if (((ulong)local_1a8 & 1) == 0) {
      LOCK();
      *(int *)local_1a8 = *(int *)local_1a8 + 1;
      UNLOCK();
      aVar18.status_.rep_ = *(Status *)this;
    }
    if (aVar18 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                   )0x1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )local_1a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a0);
        x_01._M_str = pcVar21;
        x_01._M_len = (size_t)(psVar17->_M_dataplus)._M_p;
        ParseProto2Descriptor::SetString
                  ((ParseProto2Descriptor *)pFVar19,(Field)msg,(Msg *)psVar17->_M_string_length,x_01
                  );
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_1a8);
        goto LAB_002bbb69;
      }
      goto LAB_002bbe7b;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1a8);
    break;
  case 3:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,2,uVar20);
    pMVar24 = lex->path_;
    pcVar21 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)bVar4;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._1_3_ = 0;
    local_1a8[0] = bVar4;
    auStack_1a0[0x18] = SUB81(pcVar21,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar21 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar21;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar5._M_current = local_1a8;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_8_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_1a8,lex);
    *(undefined1 (*) [8])this = local_1a8;
    aVar18 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_1a8;
    if (((ulong)local_1a8 & 1) == 0) {
      LOCK();
      *(int *)local_1a8 = *(int *)local_1a8 + 1;
      UNLOCK();
      aVar18.status_.rep_ = *(Status *)this;
    }
    if (aVar18 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                   )0x1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )local_1a8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) goto LAB_002bbe85;
      ParseProto2Descriptor::SetDouble(pFVar19,msg,(double)auStack_1a0._0_8_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1a8);
LAB_002bbb69:
      *ppCVar23 = *ppCVar23 + -1;
      goto switchD_002babd1_default;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1a8);
    break;
  case 4:
  case 5:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,4,uVar20);
    pMVar24 = lex->path_;
    pcVar21 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)bVar4;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._0_4_ = CONCAT31(0,bVar4);
    auStack_1a0[0x18] = SUB81(pcVar21,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar21 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar21;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      (iVar5._M_current)->type = local_1a8._0_4_;
      *(undefined4 *)&(iVar5._M_current)->field_0x4 = local_1a8._4_4_;
      *(undefined4 *)&((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_4_;
      *(undefined4 *)((long)&((iVar5._M_current)->type_name)._M_len + 4) = auStack_1a0._4_4_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    if (local_120 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002bbe64;
    if (auStack_118._0_4_ == 4) {
      x = 0xfa;
      JsonLexer::Expect((JsonLexer *)this,lex,4);
    }
    else {
      x = 0xe9;
      JsonLexer::Expect((JsonLexer *)this,lex,5);
    }
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto2Descriptor::SetBool
                ((ParseProto2Descriptor *)pFVar19,(Field)msg,(Msg *)(ulong)(auStack_118._0_4_ == 4),
                 (bool)x);
      goto LAB_002bbb69;
    }
    break;
  case 6:
    pFVar19 = Proto2Descriptor::MustHaveField(desc,1,uVar20);
    pMVar24 = lex->path_;
    pcVar21 = (pFVar19->all_names_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar19->all_names_->_M_string_length;
    bVar4 = pFVar19->type_;
    auStack_1a0._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar19);
    local_1a8._0_4_ = CONCAT31(0,bVar4);
    auStack_1a0[0x18] = SUB81(pcVar21,0);
    auStack_1a0._25_7_ = (undefined7)((ulong)pcVar21 >> 8);
    auStack_1a0._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a0._16_8_ = pcVar6;
    if (iVar5._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar5,(Component *)local_1a8);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar21;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a0._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a0._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar6;
      (iVar5._M_current)->type = local_1a8._0_4_;
      *(undefined4 *)&(iVar5._M_current)->field_0x4 = local_1a8._4_4_;
      *(undefined4 *)&((iVar5._M_current)->type_name)._M_len = auStack_1a0._0_4_;
      *(undefined4 *)((long)&((iVar5._M_current)->type_name)._M_len + 4) = auStack_1a0._4_4_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    x_00 = 0x3d5fbc;
    JsonLexer::Expect((JsonLexer *)this,lex,4);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto2Descriptor::SetEnum((ParseProto2Descriptor *)pFVar19,(Field)msg,(Msg *)0x0,x_00);
      goto LAB_002bbb69;
    }
    break;
  default:
switchD_002babd1_default:
    *(undefined8 *)this = 1;
    goto LAB_002bbb81;
  }
  *ppCVar23 = *ppCVar23 + -1;
LAB_002bbb81:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_120.status_);
  return (Status)extraout_RAX_00;
code_r0x002bb362:
  if (!bVar11) {
    pcVar21 = "expected \',\'";
LAB_002bb393:
    SVar16 = JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,pcVar21);
    return (Status)SVar16.rep_;
  }
  goto LAB_002bad39;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}